

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::BeginImplFrameArgs::~BeginImplFrameArgs(BeginImplFrameArgs *this)

{
  BeginImplFrameArgs *this_local;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__BeginImplFrameArgs_009c1c38;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  protozero::CopyablePtr<perfetto::protos::gen::BeginImplFrameArgs_TimestampsInUs>::~CopyablePtr
            (&this->timestamps_in_us_);
  protozero::CopyablePtr<perfetto::protos::gen::BeginFrameArgs>::~CopyablePtr(&this->last_args_);
  protozero::CopyablePtr<perfetto::protos::gen::BeginFrameArgs>::~CopyablePtr(&this->current_args_);
  protozero::CppMessageObj::~CppMessageObj(&this->super_CppMessageObj);
  return;
}

Assistant:

BeginImplFrameArgs::~BeginImplFrameArgs() = default;